

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

int mfndpos(monst *mon,coord *poss,long *info,long flag)

{
  char x_00;
  char y_00;
  char cVar1;
  byte bVar2;
  permonst *mdat_00;
  char cVar3;
  char cVar4;
  bool bVar5;
  boolean bVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  obj *poVar10;
  trap *ptVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  monst *local_a8;
  char local_9c;
  char local_98;
  int local_94;
  int local_90;
  bool local_8b;
  bool local_84;
  trap *ttmp;
  long mmflag;
  monst *mtmp2;
  int local_60;
  boolean checkobj;
  int iStack_5c;
  boolean monseeu;
  int dispy;
  int dispx;
  obj *mw_tmp;
  int maxy;
  int maxx;
  bool local_3b;
  boolean thrudoor;
  boolean treeok;
  boolean rockok;
  boolean nodiag;
  boolean lavaok;
  boolean poolok;
  boolean wantpool;
  uchar nowtyp;
  uchar ntyp;
  int cnt;
  xchar ny;
  xchar nx;
  xchar y;
  xchar x;
  permonst *mdat;
  long flag_local;
  long *info_local;
  coord *poss_local;
  monst *mon_local;
  
  mdat_00 = mon->data;
  _treeok = 0;
  bVar13 = false;
  bVar14 = false;
  x_00 = mon->mx;
  y_00 = mon->my;
  cVar1 = level->locations[x_00][y_00].typ;
  local_3b = mdat_00->mlet == '9';
  bVar5 = true;
  if (((mdat_00->mflags1 & 1) == 0) && (bVar5 = true, (mdat_00->mflags1 & 0x10) == 0)) {
    bVar5 = (mdat_00->mflags1 & 2) != 0 && !local_3b;
  }
  local_84 = true;
  if (((mdat_00->mflags1 & 1) == 0) && (local_84 = true, (mdat_00->mflags1 & 0x10) == 0)) {
    local_84 = mdat_00 == mons + 0xa0 || mdat_00 == mons + 0x157;
  }
  bVar12 = (flag & 0x5000000U) != 0;
  mdat = (permonst *)flag;
  if ((flag & 0x8000000U) != 0) {
    if ((mdat_00->mflags1 & 0x40) == 0) {
      bVar14 = true;
      bVar13 = true;
    }
    else {
      poVar10 = mon->mw;
      if (((poVar10 == (obj *)0x0) || ((*(uint *)&poVar10->field_0x4a & 1) == 0)) ||
         (mon->weapon_check != '\0')) {
        poVar10 = m_carrying(mon,0x108);
        bVar13 = true;
        if (poVar10 == (obj *)0x0) {
          poVar10 = m_carrying(mon,0x33);
          bVar13 = false;
          if (poVar10 != (obj *)0x0) {
            poVar10 = which_armor(mon,8);
            bVar13 = poVar10 == (obj *)0x0;
          }
        }
        poVar10 = m_carrying(mon,0x1b);
        bVar14 = true;
        if (poVar10 == (obj *)0x0) {
          poVar10 = m_carrying(mon,0x1c);
          bVar14 = false;
          if (poVar10 != (obj *)0x0) {
            poVar10 = which_armor(mon,8);
            bVar14 = poVar10 == (obj *)0x0;
          }
        }
      }
      else {
        if ((poVar10->oclass == '\x02') || (bVar13 = false, poVar10->oclass == '\x06')) {
          bVar13 = objects[poVar10->otyp].oc_subtyp == '\x04';
        }
        if ((poVar10->oclass == '\x02') || (bVar14 = false, poVar10->oclass == '\x06')) {
          bVar14 = objects[poVar10->otyp].oc_subtyp == '\x03';
        }
      }
    }
    local_8b = bVar13 || bVar14;
    bVar12 = bVar12 || local_8b;
  }
  do {
    if ((*(uint *)&mon->field_0x60 >> 0x15 & 1) != 0) {
      mdat = (permonst *)((ulong)mdat & 0xffffffffffdfffff | 0x1e0000);
    }
    if ((*(uint *)&mon->field_0x60 >> 0x11 & 1) == 0) {
      mdat = (permonst *)((ulong)mdat | 0x40000000);
    }
    if (x_00 + 1 < 0x4f) {
      local_90 = x_00 + 1;
    }
    else {
      local_90 = 0x4f;
    }
    if (y_00 + 1 < 0x14) {
      local_94 = y_00 + 1;
    }
    else {
      local_94 = 0x14;
    }
    if (x_00 + -1 < 1) {
      local_98 = '\x01';
    }
    else {
      local_98 = x_00 + -1;
    }
    for (wantpool = local_98; wantpool <= local_90; wantpool = wantpool + '\x01') {
      if (y_00 + -1 < 0) {
        local_9c = '\0';
      }
      else {
        local_9c = y_00 + -1;
      }
      for (poolok = local_9c; poolok <= local_94; poolok = poolok + '\x01') {
        if ((wantpool == x_00) && (poolok == y_00)) goto LAB_0024a07e;
        bVar2 = level->locations[wantpool][poolok].typ;
        if ((bVar2 < 0x11) &&
           ((((ulong)mdat & 0x4000000) == 0 ||
            (bVar6 = may_passwall(level,wantpool,poolok), bVar6 == '\0')))) {
          if ((bVar2 == 0xd) ||
             (((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) != 0 && (bVar2 == 0)))) {
            if (bVar14) goto LAB_00249502;
          }
          else if (bVar13) {
LAB_00249502:
            bVar6 = may_dig(level,wantpool,poolok);
            if (bVar6 != '\0') goto LAB_00249528;
          }
        }
        else {
LAB_00249528:
          if (((((bVar2 != 0x16) || (((ulong)mdat & 0x10000000) != 0)) &&
               ((((bVar2 != 0x17 || ((mdat_00->mflags1 & 4) != 0)) ||
                 ((((*(uint *)&level->locations[wantpool][poolok].field_0x6 >> 4 & 4) == 0 ||
                   (((ulong)mdat & 0x400000) != 0)) &&
                  (((*(uint *)&level->locations[wantpool][poolok].field_0x6 >> 4 & 8) == 0 ||
                   (((ulong)mdat & 0x800000) != 0)))))) || (bVar12)))) &&
              (((wantpool == x_00 || (poolok == y_00)) ||
               (((mdat_00 != mons + 0x78 &&
                 ((cVar1 != '\x17' ||
                  (((*(uint *)&level->locations[x_00][y_00].field_0x6 >> 4 & 0x1e) == 0 &&
                   (bVar6 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar6 == '\0')))))) &&
                ((bVar2 != 0x17 ||
                 (((*(uint *)&level->locations[wantpool][poolok].field_0x6 >> 4 & 0x1e) == 0 &&
                  (bVar6 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar6 == '\0'))))))))))
             && (((bVar6 = is_pool(level,(int)wantpool,(int)poolok), (bool)bVar6 == local_3b ||
                  (bVar5)) &&
                 ((local_84 || (bVar6 = is_lava(level,(int)wantpool,(int)poolok), bVar6 == '\0')))))
             ) {
            bVar15 = false;
            if ((((*(uint *)&mon->field_0x60 >> 0x11 & 1) != 0) &&
                ((((u.uprops[0xd].intrinsic != 0 || (u.uprops[0xd].extrinsic != 0)) ||
                  (youmonst.data == mons + 0x9e)) || (bVar15 = true, youmonst.data == mons + 0x7b)))
                ) && (bVar15 = true, u.uprops[0xd].blocked == 0)) {
              bVar15 = (mdat_00->mflags1 & 0x1000000) != 0;
            }
            bVar16 = level->objects[wantpool][poolok] != (obj *)0x0;
            cVar3 = poolok;
            cVar4 = wantpool;
            if (((u.uprops[0x2d].extrinsic != 0) && (bVar15)) &&
               ((mon->mux == wantpool && (mon->muy == poolok)))) {
              cVar3 = u.uy;
              cVar4 = u.ux;
            }
            iStack_5c = (int)cVar4;
            local_60 = (int)cVar3;
            info[_treeok] = 0;
            if (((bVar16) || (u.uprops[0x2d].extrinsic != 0)) &&
               (bVar6 = onscary(iStack_5c,local_60,mon), bVar6 != '\0')) {
              if (((ulong)mdat & 0x40000000) == 0) goto LAB_0024a07e;
              info[_treeok] = info[_treeok] | 0x40000000;
            }
            if (((wantpool == u.ux) && (poolok == u.uy)) ||
               ((wantpool == mon->mux && (poolok == mon->muy)))) {
              if ((wantpool == u.ux) && (poolok == u.uy)) {
                mon->mux = u.ux;
                mon->muy = u.uy;
              }
              if (((ulong)mdat & 0x40000) == 0) goto LAB_0024a07e;
              info[_treeok] = info[_treeok] | 0x40000;
            }
            else {
              if ((level->monsters[wantpool][poolok] != (monst *)0x0) &&
                 ((*(uint *)&level->monsters[wantpool][poolok]->field_0x60 >> 9 & 1) == 0)) {
                if ((level->monsters[wantpool][poolok] == (monst *)0x0) ||
                   ((*(uint *)&level->monsters[wantpool][poolok]->field_0x60 >> 9 & 1) != 0)) {
                  local_a8 = (monst *)0x0;
                }
                else {
                  local_a8 = level->monsters[wantpool][poolok];
                }
                uVar8 = mm_aggression(mon,local_a8);
                if ((((ulong)mdat | uVar8) & 0x80000) == 0) goto LAB_0024a07e;
                info[_treeok] = info[_treeok] | 0x80000;
                if (local_a8->mtame != '\0') {
                  if ((((ulong)mdat | uVar8) & 0x100000) == 0) goto LAB_0024a07e;
                  info[_treeok] = info[_treeok] | 0x100000;
                }
              }
              if (((((*(uint *)&(level->flags).field_0x8 >> 8 & 1) != 0) &&
                   (pcVar9 = in_rooms(level,wantpool,poolok,10), *pcVar9 != '\0')) &&
                  (pcVar9 = in_rooms(level,x_00,y_00,10), *pcVar9 == '\0')) &&
                 (bVar6 = in_your_sanctuary((monst *)0x0,wantpool,poolok), bVar6 != '\0')) {
                if (((ulong)mdat & 0x20000000) == 0) goto LAB_0024a07e;
                info[_treeok] = info[_treeok] | 0x20000000;
              }
            }
            if ((bVar16) &&
               (poVar10 = sobj_at(0x11d,level,(int)wantpool,(int)poolok), poVar10 != (obj *)0x0)) {
              if (((ulong)mdat & 0x80000000) != 0) goto LAB_0024a07e;
              info[_treeok] = info[_treeok] | 0x80000000;
            }
            if ((bVar16) &&
               (poVar10 = sobj_at(0x214,level,(int)wantpool,(int)poolok), poVar10 != (obj *)0x0)) {
              if (((ulong)mdat & 0x2000000) == 0) goto LAB_0024a07e;
              info[_treeok] = info[_treeok] | 0x2000000;
            }
            if ((bVar15) &&
               (bVar6 = online2((int)wantpool,(int)poolok,(int)u.ux,(int)u.uy), bVar6 != '\0')) {
              if (((ulong)mdat & 0x200000) != 0) goto LAB_0024a07e;
              info[_treeok] = info[_treeok] | 0x200000;
            }
            if ((((wantpool == x_00) || (poolok == y_00)) ||
                (bVar6 = bad_rock(mdat_00,'\0',x_00,poolok), bVar6 == '\0')) ||
               ((bVar6 = bad_rock(mdat_00,'\0',wantpool,y_00), bVar6 == '\0' ||
                ((mdat_00->msize < 3 && (iVar7 = curr_mon_load(mon), iVar7 < 0x259)))))) {
              ptVar11 = t_at(level,(int)wantpool,(int)poolok);
              if (ptVar11 != (trap *)0x0) {
                if ((0x18 < (ptVar11->field_0x8 & 0x1f)) || ((ptVar11->field_0x8 & 0x1f) == 0)) {
                  impossible("A monster looked at a very strange trap of type %d.",
                             (ulong)(ptVar11->field_0x8 & 0x1f));
                  goto LAB_0024a07e;
                }
                if ((((((ptVar11->field_0x8 & 0x1f) != 9) || (mdat_00 == mons + 0x10a)) &&
                     ((ptVar11->field_0x8 & 0x1f) != 0x14)) &&
                    (((((((ptVar11->field_0x8 & 0x1f) != 0xb && ((ptVar11->field_0x8 & 0x1f) != 0xc)
                         ) && (((ptVar11->field_0x8 & 0x1f) != 0xe &&
                               ((ptVar11->field_0x8 & 0x1f) != 0xd)))) ||
                       ((((mdat_00->mflags1 & 1) == 0 && (mdat_00->mlet != '\x05')) &&
                        ((mdat_00->mflags1 & 0x10) == 0)))) ||
                      (u.uz.dnum == dungeon_topology.d_sokoban_dnum)) &&
                     ((((((ptVar11->field_0x8 & 0x1f) != 8 || ((mon->mintrinsics & 4) == 0)) &&
                        (((ptVar11->field_0x8 & 0x1f) != 5 ||
                         (((1 < mdat_00->msize && ((mdat_00->mflags1 & 4) == 0)) &&
                          ((mdat_00->mflags1 & 1) == 0)))))) &&
                       (((ptVar11->field_0x8 & 0x1f) != 10 || ((mon->mintrinsics & 1) == 0)))) &&
                      (((ptVar11->field_0x8 & 0x1f) != 4 || ((mdat_00->mflags1 & 1) == 0)))))))) &&
                   (((ptVar11->field_0x8 & 0x1f) != 0x13 ||
                    ((((mdat_00->mflags1 & 4) == 0 && (mdat_00 != mons + 0x62)) &&
                     (mdat_00 != mons + 100)))))) {
                  if ((((ulong)mdat & 0x20000) == 0) &&
                     (((ulong)mon->mtrapseen & 1L << ((ptVar11->field_0x8 & 0x1f) - 1 & 0x3f)) != 0)
                     ) goto LAB_0024a07e;
                  info[_treeok] = info[_treeok] | 0x20000;
                }
              }
              poss[_treeok].x = wantpool;
              poss[_treeok].y = poolok;
              _treeok = _treeok + 1;
            }
          }
        }
LAB_0024a07e:
      }
    }
    if (((_treeok != 0) || (local_3b == false)) ||
       (bVar6 = is_pool(level,(int)x_00,(int)y_00), bVar6 != '\0')) {
      return _treeok;
    }
    local_3b = false;
  } while( true );
}

Assistant:

int mfndpos(struct monst *mon,
	    coord *poss,	/* coord poss[9] */
	    long *info,		/* long info[9] */
	    long flag)
{
	const struct permonst *mdat = mon->data;
	xchar x,y,nx,ny;
	int cnt = 0;
	uchar ntyp;
	uchar nowtyp;
	boolean wantpool,poolok,lavaok,nodiag;
	boolean rockok = FALSE, treeok = FALSE, thrudoor;
	int maxx, maxy;

	x = mon->mx;
	y = mon->my;
	nowtyp = level->locations[x][y].typ;

	nodiag = (mdat == &mons[PM_GRID_BUG]);
	wantpool = mdat->mlet == S_EEL;
	poolok = is_flyer(mdat) || is_clinger(mdat) ||
		 (is_swimmer(mdat) && !wantpool);
	lavaok = is_flyer(mdat) || is_clinger(mdat) || likes_lava(mdat);
	thrudoor = ((flag & (ALLOW_WALL|BUSTDOOR)) != 0L);
	if (flag & ALLOW_DIG) {
	    struct obj *mw_tmp;

	    /* need to be specific about what can currently be dug */
	    if (!needspick(mdat)) {
		rockok = treeok = TRUE;
	    } else if ((mw_tmp = MON_WEP(mon)) && mw_tmp->cursed &&
		       mon->weapon_check == NO_WEAPON_WANTED) {
		rockok = is_pick(mw_tmp);
		treeok = is_axe(mw_tmp);
	    } else {
		rockok = (m_carrying(mon, PICK_AXE) ||
			  (m_carrying(mon, DWARVISH_MATTOCK) &&
			   !which_armor(mon, W_ARMS)));
		treeok = (m_carrying(mon, AXE) ||
			  (m_carrying(mon, BATTLE_AXE) &&
			   !which_armor(mon, W_ARMS)));
	    }
	    thrudoor |= rockok || treeok;
	}

nexttry:	/* eels prefer the water, but if there is no water nearby,
		   they will crawl over land */
	if (mon->mconf) {
		flag |= ALLOW_ALL;
		flag &= ~NOTONL;
	}
	if (!mon->mcansee)
		flag |= ALLOW_SSM;
	maxx = min(x+1,COLNO-1);
	maxy = min(y+1,ROWNO-1);
	for (nx = max(1,x-1); nx <= maxx; nx++)
	  for (ny = max(0,y-1); ny <= maxy; ny++) {
	    if (nx == x && ny == y) continue;
	    if (IS_ROCK(ntyp = level->locations[nx][ny].typ) &&
	       !((flag & ALLOW_WALL) && may_passwall(level, nx,ny)) &&
	       !((IS_TREE(level, ntyp) ? treeok : rockok) && may_dig(level, nx,ny))) continue;
	    /* KMH -- Added iron bars */
	    if (ntyp == IRONBARS && !(flag & ALLOW_BARS)) continue;
	    if (IS_DOOR(ntyp) && !amorphous(mdat) &&
	       ((level->locations[nx][ny].doormask & D_CLOSED && !(flag & OPENDOOR)) ||
		(level->locations[nx][ny].doormask & D_LOCKED && !(flag & UNLOCKDOOR))) &&
	       !thrudoor) continue;
	    if (nx != x && ny != y && (nodiag ||
	       ((IS_DOOR(nowtyp) &&
		 ((level->locations[x][y].doormask & ~D_BROKEN) || Is_rogue_level(&u.uz))) ||
		(IS_DOOR(ntyp) &&
		 ((level->locations[nx][ny].doormask & ~D_BROKEN) || Is_rogue_level(&u.uz))))
	       ))
		continue;
	    if ((is_pool(level, nx,ny) == wantpool || poolok) &&
	       (lavaok || !is_lava(level, nx,ny))) {
		int dispx, dispy;
		boolean monseeu = (mon->mcansee && (!Invis || perceives(mdat)));
		boolean checkobj = OBJ_AT(nx, ny);

		/* Displacement also displaces the Elbereth/scare monster,
		 * as long as you are visible.
		 */
		if (Displaced && monseeu && (mon->mux==nx) && (mon->muy==ny)) {
		    dispx = u.ux;
		    dispy = u.uy;
		} else {
		    dispx = nx;
		    dispy = ny;
		}

		info[cnt] = 0;
		if ((checkobj || Displaced) && onscary(dispx, dispy, mon)) {
		    if (!(flag & ALLOW_SSM)) continue;
		    info[cnt] |= ALLOW_SSM;
		}
		if ((nx == u.ux && ny == u.uy) ||
		   (nx == mon->mux && ny == mon->muy)) {
			if (nx == u.ux && ny == u.uy) {
				/* If it's right next to you, it found you,
				 * displaced or no.  We must set mux and muy
				 * right now, so when we return we can tell
				 * that the ALLOW_U means to attack _you_ and
				 * not the image.
				 */
				mon->mux = u.ux;
				mon->muy = u.uy;
			}
			if (!(flag & ALLOW_U)) continue;
			info[cnt] |= ALLOW_U;
		} else {
			if (MON_AT(level, nx, ny)) {
				struct monst *mtmp2 = m_at(level, nx, ny);
				long mmflag = flag | mm_aggression(mon, mtmp2);

				if (!(mmflag & ALLOW_M)) continue;
				info[cnt] |= ALLOW_M;
				if (mtmp2->mtame) {
					if (!(mmflag & ALLOW_TM)) continue;
					info[cnt] |= ALLOW_TM;
				}
			}
			/* Note: ALLOW_SANCT only prevents movement, not */
			/* attack, into a temple. */
			if (level->flags.has_temple &&
			   *in_rooms(level, nx, ny, TEMPLE) &&
			   !*in_rooms(level, x, y, TEMPLE) &&
			   in_your_sanctuary(NULL, nx, ny)) {
				if (!(flag & ALLOW_SANCT)) continue;
				info[cnt] |= ALLOW_SANCT;
			}
		}
		if (checkobj && sobj_at(CLOVE_OF_GARLIC, level, nx, ny)) {
			if (flag & NOGARLIC) continue;
			info[cnt] |= NOGARLIC;
		}
		if (checkobj && sobj_at(BOULDER, level, nx, ny)) {
			if (!(flag & ALLOW_ROCK)) continue;
			info[cnt] |= ALLOW_ROCK;
		}
		if (monseeu && onlineu(nx,ny)) {
			if (flag & NOTONL) continue;
			info[cnt] |= NOTONL;
		}
		if (nx != x && ny != y && bad_rock(mdat, FALSE, x, ny)
			    && bad_rock(mdat, FALSE, nx, y)
			    && (bigmonst(mdat) || (curr_mon_load(mon) > 600)))
			continue;
		/* The monster avoids a particular type of trap if it's familiar
		 * with the trap type.  Pets get ALLOW_TRAPS and checking is
		 * done in dogmove.c.  In either case, "harmless" traps are
		 * neither avoided nor marked in info[].
		 */
		{ struct trap *ttmp = t_at(level, nx, ny);
		    if (ttmp) {
			if (ttmp->ttyp >= TRAPNUM || ttmp->ttyp == 0)  {
impossible("A monster looked at a very strange trap of type %d.", ttmp->ttyp);
			    continue;
			}
			if ((ttmp->ttyp != RUST_TRAP
					|| mdat == &mons[PM_IRON_GOLEM])
				&& ttmp->ttyp != STATUE_TRAP
				&& ((ttmp->ttyp != PIT
				    && ttmp->ttyp != SPIKED_PIT
				    && ttmp->ttyp != TRAPDOOR
				    && ttmp->ttyp != HOLE)
				      || (!is_flyer(mdat)
				    && !is_floater(mdat)
				    && !is_clinger(mdat))
				      || In_sokoban(&u.uz))
				&& (ttmp->ttyp != SLP_GAS_TRAP ||
				    !resists_sleep(mon))
				&& (ttmp->ttyp != BEAR_TRAP ||
				    (mdat->msize > MZ_SMALL &&
				     !amorphous(mdat) && !is_flyer(mdat)))
				&& (ttmp->ttyp != FIRE_TRAP ||
				    !resists_fire(mon))
				&& (ttmp->ttyp != SQKY_BOARD || !is_flyer(mdat))
				&& (ttmp->ttyp != WEB || (!amorphous(mdat) &&
				    !webmaker(mdat)))
			) {
			    if (!(flag & ALLOW_TRAPS)) {
				if (mon->mtrapseen & (1L << (ttmp->ttyp - 1)))
				    continue;
			    }
			    info[cnt] |= ALLOW_TRAPS;
			}
		    }
		}
		poss[cnt].x = nx;
		poss[cnt].y = ny;
		cnt++;
	    }
	}
	if (!cnt && wantpool && !is_pool(level, x,y)) {
		wantpool = FALSE;
		goto nexttry;
	}
	return cnt;
}